

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refzg.cc
# Opt level: O0

refzg_t * tchecker::refzg::factory
                    (shared_ptr<const_tchecker::ta::system_t> *system,sharing_type_t sharing_type,
                    reference_clock_variables_type_t refclocks_type,semantics_type_t semantics_type,
                    integer_t spread,size_t block_size,size_t table_size)

{
  element_type *system_00;
  semantics_t *__p;
  refzg_t *this;
  undefined1 local_48 [8];
  shared_ptr<tchecker::refzg::semantics_t> semantics;
  shared_ptr<const_tchecker::reference_clock_variables_t> r;
  size_t block_size_local;
  integer_t spread_local;
  semantics_type_t semantics_type_local;
  reference_clock_variables_type_t refclocks_type_local;
  sharing_type_t sharing_type_local;
  shared_ptr<const_tchecker::ta::system_t> *system_local;
  
  system_00 = std::
              __shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)system);
  reference_clocks_factory
            ((refzg *)&semantics.
                       super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,refclocks_type,system_00);
  __p = semantics_factory(semantics_type);
  std::shared_ptr<tchecker::refzg::semantics_t>::shared_ptr<tchecker::refzg::semantics_t,void>
            ((shared_ptr<tchecker::refzg::semantics_t> *)local_48,__p);
  this = (refzg_t *)operator_new(0x2f0);
  refzg_t::refzg_t(this,system,sharing_type,
                   (shared_ptr<const_tchecker::reference_clock_variables_t> *)
                   &semantics.
                    super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(shared_ptr<tchecker::refzg::semantics_t> *)local_48,spread,
                   block_size,table_size);
  std::shared_ptr<tchecker::refzg::semantics_t>::~shared_ptr
            ((shared_ptr<tchecker::refzg::semantics_t> *)local_48);
  std::shared_ptr<const_tchecker::reference_clock_variables_t>::~shared_ptr
            ((shared_ptr<const_tchecker::reference_clock_variables_t> *)
             &semantics.super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return this;
}

Assistant:

tchecker::refzg::refzg_t * factory(std::shared_ptr<tchecker::ta::system_t const> const & system,
                                   enum tchecker::ts::sharing_type_t sharing_type,
                                   enum tchecker::refzg::reference_clock_variables_type_t refclocks_type,
                                   enum tchecker::refzg::semantics_type_t semantics_type, tchecker::integer_t spread,
                                   std::size_t block_size, std::size_t table_size)
{
  std::shared_ptr<tchecker::reference_clock_variables_t const> r(
      tchecker::refzg::reference_clocks_factory(refclocks_type, *system));
  std::shared_ptr<tchecker::refzg::semantics_t> semantics{tchecker::refzg::semantics_factory(semantics_type)};
  return new tchecker::refzg::refzg_t(system, sharing_type, r, semantics, spread, block_size, table_size);
}